

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::ColdChunkSkipper::OnStartChunk
          (ColdChunkSkipper *this,int chunk,int cached_has_word_index,string *from,Printer *printer)

{
  vector<int,_std::allocator<int>_> *this_00;
  bool bVar1;
  int iVar2;
  size_type sVar3;
  const_reference this_01;
  reference ppFVar4;
  char *pcVar5;
  const_reference pvVar6;
  LogMessage *other;
  int __c;
  __normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
  *__rhs;
  bool local_12a;
  Hex local_120;
  allocator local_109;
  string local_108;
  LogFinisher local_e2;
  byte local_e1;
  LogMessage local_e0;
  int local_a4;
  FieldDescriptor *pFStack_a0;
  int hasbit_index;
  FieldDescriptor *field;
  const_iterator __end5;
  const_iterator __begin5;
  value_type *__range5;
  int this_word;
  uint32_t mask;
  int first_word;
  undefined4 local_64;
  undefined1 local_60 [8];
  Formatter format;
  Printer *printer_local;
  string *from_local;
  int cached_has_word_index_local;
  int chunk_local;
  ColdChunkSkipper *this_local;
  
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)printer;
  Formatter::Formatter((Formatter *)local_60,printer,&this->variables_);
  if (this->access_info_map_ == (AccessInfoMap *)0x0) {
    local_64 = 1;
  }
  else if (chunk < this->limit_chunk_) {
    local_64 = 1;
  }
  else {
    bVar1 = IsColdChunk(this,chunk);
    if (bVar1) {
      this->limit_chunk_ = chunk;
      while( true ) {
        iVar2 = this->limit_chunk_;
        sVar3 = std::
                vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                ::size(this->chunks_);
        local_12a = false;
        if ((ulong)(long)iVar2 < sVar3) {
          local_12a = IsColdChunk(this,this->limit_chunk_);
        }
        if (local_12a == false) break;
        this->limit_chunk_ = this->limit_chunk_ + 1;
      }
      if (chunk + 1 < this->limit_chunk_) {
        Formatter::operator()<>((Formatter *)local_60,"if (PROTOBUF_PREDICT_FALSE(");
        this_word = HasbitWord(this,chunk,0);
        from_local._4_4_ = chunk;
        while (from_local._4_4_ < this->limit_chunk_) {
          __range5._4_4_ = 0;
          __range5._0_4_ = HasbitWord(this,from_local._4_4_,0);
          while( true ) {
            bVar1 = false;
            if (from_local._4_4_ < this->limit_chunk_) {
              iVar2 = HasbitWord(this,from_local._4_4_,0);
              bVar1 = iVar2 == (int)__range5;
            }
            if (!bVar1) break;
            this_01 = std::
                      vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                      ::operator[](this->chunks_,(long)from_local._4_4_);
            __end5 = std::
                     vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     ::begin(this_01);
            field = (FieldDescriptor *)
                    std::
                    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ::end(this_01);
            while( true ) {
              __rhs = (__normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                       *)&field;
              bVar1 = __gnu_cxx::operator!=(&__end5,__rhs);
              if (!bVar1) break;
              ppFVar4 = __gnu_cxx::
                        __normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                        ::operator*(&__end5);
              pFStack_a0 = *ppFVar4;
              this_00 = this->has_bit_indices_;
              pcVar5 = FieldDescriptor::index(pFStack_a0,(char *)__rhs,__c);
              pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)(int)pcVar5)
              ;
              local_a4 = *pvVar6;
              local_e1 = 0;
              if ((int)__range5 != local_a4 / 0x20) {
                internal::LogMessage::LogMessage
                          (&local_e0,LOGLEVEL_DFATAL,
                           "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                           ,0x220);
                local_e1 = 1;
                other = internal::LogMessage::operator<<
                                  (&local_e0,"CHECK failed: (this_word) == (hasbit_index / 32): ");
                internal::LogFinisher::operator=(&local_e2,other);
              }
              if ((local_e1 & 1) != 0) {
                internal::LogMessage::~LogMessage(&local_e0);
              }
              __range5._4_4_ = 1 << ((byte)((long)local_a4 % 0x20) & 0x1f) | __range5._4_4_;
              __gnu_cxx::
              __normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
              ::operator++(&__end5);
            }
            from_local._4_4_ = from_local._4_4_ + 1;
          }
          if ((int)__range5 != this_word) {
            Formatter::operator()<>((Formatter *)local_60," ||\n    ");
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_108,"mask",&local_109);
          strings::Hex::Hex<unsigned_int>(&local_120,__range5._4_4_,ZERO_PAD_8);
          Formatter::Set<google::protobuf::strings::Hex>
                    ((Formatter *)local_60,&local_108,&local_120);
          std::__cxx11::string::~string((string *)&local_108);
          std::allocator<char>::~allocator((allocator<char> *)&local_109);
          if ((int)__range5 == cached_has_word_index) {
            Formatter::operator()<>((Formatter *)local_60,"(cached_has_bits & 0x$mask$u) != 0");
          }
          else {
            Formatter::operator()
                      ((Formatter *)local_60,"($1$_has_bits_[$2$] & 0x$mask$u) != 0",from,
                       (int *)&__range5);
          }
        }
        Formatter::operator()<>((Formatter *)local_60,")) {\n");
        Formatter::Indent((Formatter *)local_60);
        local_64 = 0;
      }
      else {
        this->limit_chunk_ = -1;
        local_64 = 1;
      }
    }
    else {
      local_64 = 1;
    }
  }
  Formatter::~Formatter((Formatter *)local_60);
  return;
}

Assistant:

void ColdChunkSkipper::OnStartChunk(int chunk, int cached_has_word_index,
                                    const std::string& from,
                                    io::Printer* printer) {
  Formatter format(printer, variables_);
  if (!access_info_map_) {
    return;
  } else if (chunk < limit_chunk_) {
    // We are already inside a run of cold chunks.
    return;
  } else if (!IsColdChunk(chunk)) {
    // We can't start a run of cold chunks.
    return;
  }

  // Find the end of consecutive cold chunks.
  limit_chunk_ = chunk;
  while (limit_chunk_ < chunks_.size() && IsColdChunk(limit_chunk_)) {
    limit_chunk_++;
  }

  if (limit_chunk_ <= chunk + 1) {
    // Require at least two chunks to emit external has_bit checks.
    limit_chunk_ = -1;
    return;
  }

  // Emit has_bit check for each has_bit_dword index.
  format("if (PROTOBUF_PREDICT_FALSE(");
  int first_word = HasbitWord(chunk, 0);
  while (chunk < limit_chunk_) {
    uint32_t mask = 0;
    int this_word = HasbitWord(chunk, 0);
    // Generate mask for chunks on the same word.
    for (; chunk < limit_chunk_ && HasbitWord(chunk, 0) == this_word; chunk++) {
      for (auto field : chunks_[chunk]) {
        int hasbit_index = has_bit_indices_[field->index()];
        // Fields on a chunk must be in the same word.
        GOOGLE_CHECK_EQ(this_word, hasbit_index / 32);
        mask |= 1 << (hasbit_index % 32);
      }
    }

    if (this_word != first_word) {
      format(" ||\n    ");
    }
    format.Set("mask", strings::Hex(mask, strings::ZERO_PAD_8));
    if (this_word == cached_has_word_index) {
      format("(cached_has_bits & 0x$mask$u) != 0");
    } else {
      format("($1$_has_bits_[$2$] & 0x$mask$u) != 0", from, this_word);
    }
  }
  format(")) {\n");
  format.Indent();
}